

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

bool QMakeInternal::IoUtils::touchFile
               (QString *targetFileName,QString *referenceFileName,QString *errorString)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  QString *in_RDX;
  QString *in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  bool utimeError;
  timespec times [2];
  stat st;
  QString *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  char (*in_stack_fffffffffffffdf8) [37];
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  QString *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe14;
  uint uVar10;
  bool local_1c9;
  storage_type *local_1c0;
  undefined1 local_1b0 [24];
  storage_type *local_198;
  undefined1 local_188 [72];
  char *local_140;
  storage_type *local_138;
  undefined1 local_128 [24];
  storage_type *local_110;
  undefined1 local_100 [72];
  timespec local_b8;
  __time_t local_a8;
  long local_a0;
  stat local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_98,0xaa,0x90);
  QString::toLocal8Bit(in_stack_fffffffffffffe08);
  pcVar3 = QByteArray::constData((QByteArray *)0x2c3bf1);
  iVar1 = stat(pcVar3,&local_98);
  QByteArray::~QByteArray((QByteArray *)0x2c3c12);
  if (iVar1 == 0) {
    local_b8.tv_sec = 0;
    local_b8.tv_nsec = 0x3fffffff;
    local_a8 = local_98.st_mtim.tv_sec;
    local_a0 = local_98.st_mtim.tv_nsec;
    QString::toLocal8Bit(in_stack_fffffffffffffe08);
    pcVar3 = QByteArray::constData((QByteArray *)0x2c3d98);
    iVar2 = utimensat(-100,pcVar3,&local_b8,0);
    uVar5 = iVar2 < 0;
    QByteArray::~QByteArray((QByteArray *)0x2c3dc6);
    uVar10 = CONCAT13(uVar5,(int3)in_stack_fffffffffffffe14) & 0x1ffffff;
    if ((char)(uVar10 >> 0x18) == '\0') {
      local_1c9 = true;
    }
    else {
      QByteArrayView::QByteArrayView<21ul>
                ((QByteArrayView *)CONCAT17(uVar5,in_stack_fffffffffffffe00),
                 (char (*) [21])in_stack_fffffffffffffdf8);
      QVar8.m_data = local_198;
      QVar8.m_size = (qsizetype)local_188;
      QString::fromLatin1(QVar8);
      piVar4 = __errno_location();
      strerror(*piVar4);
      QByteArrayView::QByteArrayView<char_*,_true>
                ((QByteArrayView *)CONCAT17(uVar5,in_stack_fffffffffffffe00),in_RDI);
      QVar9.m_data = local_1c0;
      QVar9.m_size = (qsizetype)local_1b0;
      QString::fromLatin1(QVar9);
      QString::arg<QString_const&,QString>
                (in_RDX,(QString *)CONCAT44(uVar10,iVar1),in_stack_fffffffffffffe08);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                         in_stack_fffffffffffffde8);
      QString::~QString((QString *)0x2c3e88);
      QString::~QString((QString *)0x2c3e92);
      QString::~QString((QString *)0x2c3e9f);
      local_1c9 = false;
    }
  }
  else {
    QByteArrayView::QByteArrayView<37ul>
              ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8);
    QVar6.m_data = local_110;
    QVar6.m_size = (qsizetype)local_100;
    QString::fromLatin1(QVar6);
    piVar4 = __errno_location();
    local_140 = strerror(*piVar4);
    QByteArrayView::QByteArrayView<char_*,_true>
              ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (char **)in_stack_fffffffffffffdf8);
    QVar7.m_data = local_138;
    QVar7.m_size = (qsizetype)local_128;
    QString::fromLatin1(QVar7);
    QString::arg<QString_const&,QString>
              (in_RDX,(QString *)CONCAT44(in_stack_fffffffffffffe14,iVar1),in_RSI);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                       in_stack_fffffffffffffde8);
    QString::~QString((QString *)0x2c3ce1);
    QString::~QString((QString *)0x2c3cee);
    QString::~QString((QString *)0x2c3cfb);
    local_1c9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c9;
  }
  __stack_chk_fail();
}

Assistant:

bool IoUtils::touchFile(const QString &targetFileName, const QString &referenceFileName, QString *errorString)
{
#  ifdef Q_OS_UNIX
    struct stat st;
    if (stat(referenceFileName.toLocal8Bit().constData(), &st)) {
        *errorString = fL1S("Cannot stat() reference file %1: %2.").arg(referenceFileName, fL1S(strerror(errno)));
        return false;
    }
#    if (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    const struct timespec times[2] = { { 0, UTIME_NOW },
#      if defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L
        st.st_mtim // POSIX.1-2008
#      else
        st.st_mtimespec // Darwin
#      endif
    };
    const bool utimeError = utimensat(AT_FDCWD, targetFileName.toLocal8Bit().constData(), times, 0) < 0;
#    else
    struct utimbuf utb;
    utb.actime = time(0);
    utb.modtime = st.st_mtime;
    const bool utimeError= utime(targetFileName.toLocal8Bit().constData(), &utb) < 0;
#    endif // (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    if (utimeError) {
        *errorString = fL1S("Cannot touch %1: %2.").arg(targetFileName, fL1S(strerror(errno)));
        return false;
    }
#  else
    HANDLE rHand = CreateFile((wchar_t*)referenceFileName.utf16(),
                              GENERIC_READ, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (rHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open reference file %1: %2")
            .arg(referenceFileName, QSystemError::windowsString());
        return false;
        }
    FILETIME ft;
    GetFileTime(rHand, NULL, NULL, &ft);
    CloseHandle(rHand);
    HANDLE wHand = CreateFile((wchar_t*)targetFileName.utf16(),
                              GENERIC_WRITE, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (wHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open %1: %2")
            .arg(targetFileName, QSystemError::windowsString());
        return false;
    }
    SetFileTime(wHand, NULL, NULL, &ft);
    CloseHandle(wHand);
#  endif // Q_OS_UNIX
    return true;
}